

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

string * __thiscall
google::protobuf::Reflection::GetStringReference
          (Reflection *this,Message *message,FieldDescriptor *field,string *scratch)

{
  void *pvVar1;
  bool bVar2;
  CppStringType CVar3;
  uint32_t uVar4;
  OneofDescriptor *pOVar5;
  Cord **ppCVar6;
  string *psVar7;
  ArenaStringPtr *pAVar8;
  Cord *src;
  char *description;
  Descriptor *pDVar9;
  Metadata MVar10;
  
  MVar10 = Message::GetMetadata(message);
  if (MVar10.reflection != this) {
    pDVar9 = this->descriptor_;
    MVar10 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar9,MVar10.descriptor,field,"GetStringReference");
  }
  pDVar9 = this->descriptor_;
  if (field->containing_type_ == pDVar9) {
    bVar2 = FieldDescriptor::is_repeated(field);
    if (!bVar2) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"GetStringReference",CPPTYPE_STRING);
      }
      if ((field->field_0x1 & 8) != 0) {
        uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        psVar7 = internal::ExtensionSet::GetString
                           ((ExtensionSet *)
                            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
                            field->number_,(field->field_20).default_value_string_);
        return psVar7;
      }
      pOVar5 = FieldDescriptor::real_containing_oneof(field);
      if ((pOVar5 == (OneofDescriptor *)0x0) || (bVar2 = HasOneofField(this,message,field), bVar2))
      {
        CVar3 = FieldDescriptor::cpp_string_type(field);
        if ((CVar3 != kView) && (CVar3 != kString)) {
          if (CVar3 == kCord) {
            pOVar5 = FieldDescriptor::real_containing_oneof(field);
            if (pOVar5 == (OneofDescriptor *)0x0) {
              src = GetRaw<absl::lts_20250127::Cord>(this,message,field);
            }
            else {
              ppCVar6 = GetRaw<absl::lts_20250127::Cord*>(this,message,field);
              src = *ppCVar6;
            }
            absl::lts_20250127::CopyCordToString(src,scratch);
            return scratch;
          }
          internal::Unreachable
                    ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                     ,0x7b1);
        }
        bVar2 = internal::ReflectionSchema::IsFieldInlined(&this->schema_,field);
        if (bVar2) {
          psVar7 = (string *)
                   GetRaw<google::protobuf::internal::InlinedStringField>(this,message,field);
          return psVar7;
        }
        pAVar8 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
        pvVar1 = (pAVar8->tagged_ptr_).ptr_;
        if (((ulong)pvVar1 & 3) != 0) {
          return (string *)((ulong)pvVar1 & 0xfffffffffffffffc);
        }
      }
      return (string *)(field->field_20).default_value_int64_t_;
    }
    pDVar9 = this->descriptor_;
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar9,field,"GetStringReference",description);
}

Assistant:

const std::string& Reflection::GetStringReference(const Message& message,
                                                  const FieldDescriptor* field,
                                                  std::string* scratch) const {
  (void)scratch;  // Parameter is used by Google-internal code.
  USAGE_CHECK_ALL(GetStringReference, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(
        field->number(), internal::DefaultValueStringAsString(field));
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return internal::DefaultValueStringAsString(field);
    }
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          absl::CopyCordToString(*GetField<absl::Cord*>(message, field),
                                 scratch);
        } else {
          absl::CopyCordToString(GetField<absl::Cord>(message, field), scratch);
        }
        return *scratch;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        if (IsInlined(field)) {
          return GetField<InlinedStringField>(message, field).GetNoArena();
        } else if (IsMicroString(field)) {
          *scratch = std::string(GetField<MicroString>(message, field).Get());
          return *scratch;
        } else {
          const auto& str = GetField<ArenaStringPtr>(message, field);
          return str.IsDefault() ? internal::DefaultValueStringAsString(field)
                                 : str.Get();
        }
    }
    internal::Unreachable();
  }
}